

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CPhase<std::complex<float>_>::CPhase
          (CPhase<std::complex<float>_> *this,int control,int target,angle_type *angle,
          int controlState)

{
  int controlState_local;
  angle_type *angle_local;
  int target_local;
  int control_local;
  CPhase<std::complex<float>_> *this_local;
  
  angle_local._0_4_ = target;
  angle_local._4_4_ = control;
  _target_local = this;
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0014e5c0;
  std::make_unique<qclab::qgates::Phase<std::complex<float>>,int_const&,qclab::QAngle<float>const&>
            ((int *)&this->gate_,(QAngle<float> *)&angle_local);
  if (angle_local._4_4_ < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CPhase.hpp"
                  ,0x31,
                  "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const angle_type &, const int) [T = std::complex<float>]"
                 );
  }
  if (-1 < (int)angle_local) {
    if (angle_local._4_4_ != (int)angle_local) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CPhase.hpp"
                  ,0x32,
                  "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const angle_type &, const int) [T = std::complex<float>]"
                 );
  }
  __assert_fail("target >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CPhase.hpp"
                ,0x31,
                "qclab::qgates::CPhase<std::complex<float>>::CPhase(const int, const int, const angle_type &, const int) [T = std::complex<float>]"
               );
}

Assistant:

CPhase( const int control , const int target , const angle_type& angle ,
                const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< Phase< T > >( target , angle ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }